

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool gl4cts::CopyImage::Utils::isTargetMultisampled(GLenum target)

{
  return (target & 0xfffffffd) == 0x9100;
}

Assistant:

bool Utils::isTargetMultisampled(GLenum target)
{
	bool result = false;

	switch (target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		result = true;
		break;
	default:
		break;
	}

	return result;
}